

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::ExtensionSet::Extension::MessageSetItemByteSize
          (Extension *this,int number)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  
  if ((this->type == '\v') && (this->is_repeated != true)) {
    if ((this->field_0xa & 2) == 0) {
      iVar1 = 0x1f;
      if ((number | 1U) != 0) {
        for (; (number | 1U) >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      if ((this->field_0xa & 4) == 0) {
        lVar3 = (**(code **)(*(long *)this->field_0 + 0x18))();
      }
      else {
        lVar3 = (**(code **)(*(long *)this->field_0 + 0x68))();
      }
      uVar4 = (uint)lVar3 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar5 = (ulong)(iVar1 * 9 + 0x49U >> 6) + 4 + lVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6);
    }
    else {
      sVar5 = 0;
    }
    return sVar5;
  }
  sVar5 = ByteSize(this,number);
  return sVar5;
}

Assistant:

size_t ExtensionSet::Extension::MessageSetItemByteSize(int number) const {
  if (type != WireFormatLite::TYPE_MESSAGE || is_repeated) {
    // Not a valid MessageSet extension, but compute the byte size for it the
    // normal way.
    return ByteSize(number);
  }

  if (is_cleared) return 0;

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(number);

  // message
  our_size += WireFormatLite::LengthDelimitedSize(
      is_lazy ? ptr.lazymessage_value->ByteSizeLong()
              : ptr.message_value->ByteSizeLong());

  return our_size;
}